

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3c8e00::CFLTestWithData<unsigned_short>::randData
          (CFLTestWithData<unsigned_short> *this,offset_in_ACMRandom_to_subr random)

{
  long *plVar1;
  unsigned_short uVar2;
  code *pcVar3;
  ulong uVar4;
  int iVar5;
  long in_RDX;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = (this->super_CFLTest).height;
  if (0 < iVar5) {
    plVar1 = (long *)((long)this->data + in_RDX + -4);
    uVar4 = (ulong)(uint)(this->super_CFLTest).width;
    lVar8 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar6 = (ulong)((uint)lVar8 & 0x7ffffff);
        lVar7 = 0;
        do {
          pcVar3 = (code *)random;
          if ((random & 1) != 0) {
            pcVar3 = *(code **)(*plVar1 + -1 + random);
          }
          uVar2 = (*pcVar3)(plVar1);
          this->data[uVar6 * 0x20 + lVar7] = uVar2;
          this->data_ref[uVar6 * 0x20 + lVar7] = uVar2;
          lVar7 = lVar7 + 1;
          uVar4 = (ulong)(this->super_CFLTest).width;
        } while (lVar7 < (long)uVar4);
        iVar5 = (this->super_CFLTest).height;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
  }
  return;
}

Assistant:

void randData(I (ACMRandom::*random)()) {
    for (int j = 0; j < this->height; j++) {
      for (int i = 0; i < this->width; i++) {
        const I d = (this->rnd.*random)();
        data[j * CFL_BUF_LINE + i] = d;
        data_ref[j * CFL_BUF_LINE + i] = d;
      }
    }
  }